

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O0

bool __thiscall
VGradientCache::generateGradientColorTable
          (VGradientCache *this,VGradientStops *stops,float opacity,uint32_t *colorTable,int size)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  uint32_t y;
  uint32_t uVar5;
  size_type sVar6;
  pair<float,_VColor> *ppVar7;
  int in_ECX;
  uint32_t *in_RDX;
  vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_> *in_RSI;
  float in_XMM0_Da;
  float fVar8;
  float fpos;
  float incr;
  float t;
  float delta;
  uint32_t nextColor;
  uint32_t curColor;
  VGradientStop *start;
  VGradientStop *next;
  VGradientStop *curr;
  size_t stopCount;
  bool alpha;
  size_t i;
  int pos;
  int idist;
  int dist;
  float local_78;
  uint32_t local_64;
  bool local_39;
  ulong local_38;
  int local_30;
  
  sVar6 = std::vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>::size
                    (in_RSI);
  bVar3 = vCompare(0.0,1.611496e-39);
  ppVar7 = std::vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>::data
                     ((vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>
                       *)0x118c45);
  bVar4 = VColor::isOpaque(&ppVar7->second);
  local_39 = !bVar4 || !bVar3;
  local_64 = VColor::premulARGB(&ppVar7->second,in_XMM0_Da);
  fVar8 = 1.0 / (float)in_ECX;
  local_30 = 1;
  *in_RDX = local_64;
  for (local_78 = fVar8 * 1.5; local_78 <= ppVar7->first && local_30 < in_ECX;
      local_78 = fVar8 + local_78) {
    in_RDX[local_30] = in_RDX[local_30 + -1];
    local_30 = local_30 + 1;
  }
  for (local_38 = 0; local_38 < sVar6 - 1; local_38 = local_38 + 1) {
    fVar1 = ppVar7[local_38 + 1].first;
    fVar2 = ppVar7[local_38].first;
    bVar3 = VColor::isOpaque(&ppVar7[local_38 + 1].second);
    if (!bVar3) {
      local_39 = true;
    }
    y = VColor::premulARGB(&ppVar7[local_38 + 1].second,in_XMM0_Da);
    for (; local_78 < ppVar7[local_38 + 1].first && local_30 < in_ECX; local_78 = fVar8 + local_78)
    {
      uVar5 = (uint32_t)((local_78 - ppVar7[local_38].first) * (1.0 / (fVar1 - fVar2)) * 255.0);
      uVar5 = interpolate_pixel(local_64,0xff - uVar5,y,uVar5);
      in_RDX[local_30] = uVar5;
      local_30 = local_30 + 1;
    }
    local_64 = y;
  }
  for (; local_30 < in_ECX; local_30 = local_30 + 1) {
    in_RDX[local_30] = local_64;
  }
  in_RDX[in_ECX + -1] = local_64;
  return local_39;
}

Assistant:

bool VGradientCache::generateGradientColorTable(const VGradientStops &stops,
                                                float                 opacity,
                                                uint32_t *colorTable, int size)
{
    int                  dist, idist, pos = 0;
    size_t               i;
    bool                 alpha = false;
    size_t               stopCount = stops.size();
    const VGradientStop *curr, *next, *start;
    uint32_t             curColor, nextColor;
    float                delta, t, incr, fpos;

    if (!vCompare(opacity, 1.0f)) alpha = true;

    start = stops.data();
    curr = start;
    if (!curr->second.isOpaque()) alpha = true;
    curColor = curr->second.premulARGB(opacity);
    incr = 1.0f / (float)size;
    fpos = 1.5f * incr;

    colorTable[pos++] = curColor;

    while (fpos <= curr->first && pos < size) {
        colorTable[pos] = colorTable[pos - 1];
        pos++;
        fpos += incr;
    }

    for (i = 0; i < stopCount - 1; ++i) {
        curr = (start + i);
        next = (start + i + 1);
        delta = 1 / (next->first - curr->first);
        if (!next->second.isOpaque()) alpha = true;
        nextColor = next->second.premulARGB(opacity);
        while (fpos < next->first && pos < size) {
            t = (fpos - curr->first) * delta;
            dist = (int)(255 * t);
            idist = 255 - dist;
            colorTable[pos] =
                interpolate_pixel(curColor, idist, nextColor, dist);
            ++pos;
            fpos += incr;
        }
        curColor = nextColor;
    }

    for (; pos < size; ++pos) colorTable[pos] = curColor;

    // Make sure the last color stop is represented at the end of the table
    colorTable[size - 1] = curColor;
    return alpha;
}